

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O2

void set_mb_mi(CommonModeInfoParams *mi_params,int width,int height)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = width + 7 >> 2;
  uVar1 = uVar4 & 0xfffffffe;
  mi_params->mi_cols = uVar1;
  uVar2 = height + 7 >> 2;
  mi_params->mi_rows = uVar2 & 0xfffffffe;
  uVar1 = uVar1 + 0x1f & 0xffffffe0;
  mi_params->mi_stride = uVar1;
  iVar5 = (int)(uVar4 + 2) >> 2;
  mi_params->mb_cols = iVar5;
  iVar3 = (int)(uVar2 + 2) >> 2;
  mi_params->mb_rows = iVar3;
  mi_params->MBs = iVar3 * iVar5;
  mi_params->mi_alloc_stride =
       (int)(uVar1 + "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [mi_params->mi_alloc_bsize] + -1) /
       (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [mi_params->mi_alloc_bsize];
  return;
}

Assistant:

static inline void set_mb_mi(CommonModeInfoParams *mi_params, int width,
                             int height) {
  mi_params->mi_cols = size_in_mi(width);
  mi_params->mi_rows = size_in_mi(height);
  mi_params->mi_stride = calc_mi_size(mi_params->mi_cols);

  mi_params->mb_cols = ROUND_POWER_OF_TWO(mi_params->mi_cols, 2);
  mi_params->mb_rows = ROUND_POWER_OF_TWO(mi_params->mi_rows, 2);
  mi_params->MBs = mi_params->mb_rows * mi_params->mb_cols;

  const int mi_alloc_size_1d = mi_size_wide[mi_params->mi_alloc_bsize];
  mi_params->mi_alloc_stride =
      (mi_params->mi_stride + mi_alloc_size_1d - 1) / mi_alloc_size_1d;

  assert(mi_size_wide[mi_params->mi_alloc_bsize] ==
         mi_size_high[mi_params->mi_alloc_bsize]);
}